

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.cpp
# Opt level: O2

String * __thiscall
MathML::AST::ConstantExpression::toString_abi_cxx11_
          (String *__return_storage_ptr__,ConstantExpression *this)

{
  Type TVar1;
  undefined1 *puVar2;
  stringstream ss;
  stringstream asStack_198 [16];
  undefined1 local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  TVar1 = this->mType;
  if (TVar1 == SCALAR_INVALID && (this->mStringValue)._M_string_length != 0) {
    puVar2 = (undefined1 *)&this->mStringValue;
LAB_00854d08:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)puVar2);
  }
  else {
    if (TVar1 == SCALAR_DOUBLE) {
      std::ostream::_M_insert<double>(this->mValue);
    }
    else {
      if (TVar1 != SCALAR_LONG) {
        if (TVar1 == SCALAR_BOOL) {
          puVar2 = SCALAR_FALSE_VALUE_abi_cxx11_;
          if (this->mValue != 0.0) {
            puVar2 = SCALAR_TRUE_VALUE_abi_cxx11_;
          }
          if (NAN(this->mValue)) {
            puVar2 = SCALAR_TRUE_VALUE_abi_cxx11_;
          }
        }
        else {
          puVar2 = SCALAR_INVALID_VALUE_abi_cxx11_;
        }
        goto LAB_00854d08;
      }
      std::ostream::_M_insert<long>((long)local_188);
    }
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

MathML::String ConstantExpression::toString() const
        {
            std::stringstream ss;

            if ( mStringValue.size() > 0 && mType == SCALAR_INVALID )
            {
                return mStringValue;
            }

            //check type
            switch ( mType )
            {

            case SCALAR_BOOL:
                return ( mValue == 0. ) ? SCALAR_FALSE_VALUE : SCALAR_TRUE_VALUE;

            case SCALAR_LONG:
                //return StringUtil::valueOf( static_cast<long>( mValue ) );
                ss << static_cast<long>( mValue );
                return ss.str();

            case SCALAR_DOUBLE:
                //return StringUtil::valueOf( mValue );
                ss << mValue;
                return ss.str();

            default:
                return SCALAR_INVALID_VALUE;
            }
        }